

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall NDevice::getName_abi_cxx11_(NDevice *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string NDevice::getName() const
{
    return name;
}